

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::JavascriptRegExp::GetSetter
          (JavascriptRegExp *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DescriptorFlags local_34 [2];
  DescriptorFlags result;
  
  propertyRecord = (PropertyRecord *)requestContext;
  ScriptContext::FindPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_48);
  if ((local_48 == (PropertyRecord *)0x0) ||
     (bVar1 = GetSetterBuiltIns(this,local_48->pid,info,local_34), !bVar1)) {
    local_34[0] = DynamicObject::GetSetter
                            (&this->super_DynamicObject,propertyNameString,setterValue,info,
                             (ScriptContext *)propertyRecord);
  }
  return local_34[0];
}

Assistant:

DescriptorFlags JavascriptRegExp::GetSetter(JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags result;
        PropertyRecord const * propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && GetSetterBuiltIns(propertyRecord->GetPropertyId(), info, &result))
        {
            return result;
        }

        return DynamicObject::GetSetter(propertyNameString, setterValue, info, requestContext);
    }